

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesFrequencyOcGetFrequencyTarget(zes_freq_handle_t hFrequency,double *pCurrentOcFrequency)

{
  zes_pfnFrequencyOcGetFrequencyTarget_t pfnOcGetFrequencyTarget;
  dditable_t *dditable;
  ze_result_t result;
  double *pCurrentOcFrequency_local;
  zes_freq_handle_t hFrequency_local;
  
  if (*(code **)(*(long *)(hFrequency + 8) + 0xb10) == (code *)0x0) {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFrequency_local._4_4_ =
         (**(code **)(*(long *)(hFrequency + 8) + 0xb10))
                   (*(undefined8 *)hFrequency,pCurrentOcFrequency);
  }
  return hFrequency_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcGetFrequencyTarget(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        double* pCurrentOcFrequency                     ///< [out] Overclocking Frequency in MHz, if extended moded is supported,
                                                        ///< will returned in 1 Mhz granularity, else, in multiples of 50 Mhz. This
                                                        ///< cannot be greater than the `maxOcFrequency` member of
                                                        ///< ::zes_oc_capabilities_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_freq_object_t*>( hFrequency )->dditable;
        auto pfnOcGetFrequencyTarget = dditable->zes.Frequency.pfnOcGetFrequencyTarget;
        if( nullptr == pfnOcGetFrequencyTarget )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFrequency = reinterpret_cast<zes_freq_object_t*>( hFrequency )->handle;

        // forward to device-driver
        result = pfnOcGetFrequencyTarget( hFrequency, pCurrentOcFrequency );

        return result;
    }